

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster_generic::try_load_foreign_module_local
          (type_caster_generic *this,handle src)

{
  PyTypeObject *pPVar1;
  _func_void_ptr_PyObject_ptr_type_info_ptr *p_Var2;
  char *__s1;
  int iVar3;
  type_info *ptVar4;
  void *pvVar5;
  error_already_set *this_00;
  bool bVar6;
  object local_30;
  handle local_28;
  
  pPVar1 = (src.m_ptr)->ob_type;
  iVar3 = PyObject_HasAttrString(pPVar1,"__pybind11_module_local_v3_clang_libstdcpp_cxxabi1002__");
  if (iVar3 == 1) {
    local_30.super_handle.m_ptr =
         (handle)PyObject_GetAttrString
                           (pPVar1,"__pybind11_module_local_v3_clang_libstdcpp_cxxabi1002__");
    if (local_30.super_handle.m_ptr == (PyObject *)0x0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    ((PyObject *)local_30.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_30.super_handle.m_ptr)->ob_refcnt + 1;
    local_28.m_ptr = (PyObject *)local_30.super_handle.m_ptr;
    ptVar4 = capsule::operator_cast_to_type_info_((capsule *)&local_28);
    object::~object((object *)&local_28);
    object::~object(&local_30);
    p_Var2 = ptVar4->module_local_load;
    if (p_Var2 != local_load) {
      if (this->cpptype != (type_info *)0x0) {
        __s1 = *(char **)(this->cpptype + 8);
        if (__s1 != *(char **)(ptVar4->cpptype + 8)) {
          if (*__s1 == '*') {
            return false;
          }
          iVar3 = strcmp(__s1,*(char **)(ptVar4->cpptype + 8));
          if (iVar3 != 0) {
            return false;
          }
        }
      }
      pvVar5 = (*p_Var2)(src.m_ptr,ptVar4);
      bVar6 = pvVar5 != (void *)0x0;
      if (bVar6) {
        this->value = pvVar5;
        return bVar6;
      }
      return bVar6;
    }
  }
  return false;
}

Assistant:

PYBIND11_NOINLINE bool try_load_foreign_module_local(handle src) {
        constexpr auto *local_key = PYBIND11_MODULE_LOCAL_ID;
        const auto pytype = src.get_type();
        if (!hasattr(pytype, local_key))
            return false;

        type_info *foreign_typeinfo = reinterpret_borrow<capsule>(getattr(pytype, local_key));
        // Only consider this foreign loader if actually foreign and is a loader of the correct cpp type
        if (foreign_typeinfo->module_local_load == &local_load
            || (cpptype && !same_type(*cpptype, *foreign_typeinfo->cpptype)))
            return false;

        if (auto result = foreign_typeinfo->module_local_load(src.ptr(), foreign_typeinfo)) {
            value = result;
            return true;
        }
        return false;
    }